

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void NavScrollToBringItemIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  undefined1 auVar1 [16];
  float fVar2;
  ImGuiContext *pIVar3;
  undefined4 in_EAX;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pIVar3 = GImGui;
  fVar5 = (window->InnerMainRect).Min.x + -1.0;
  fVar7 = (window->InnerMainRect).Min.y + -1.0;
  fVar8 = (window->InnerMainRect).Max.x + 1.0;
  fVar9 = (window->InnerMainRect).Max.y + 1.0;
  fVar10 = (item_rect->Min).x;
  fVar6 = (item_rect->Min).y;
  fVar11 = (item_rect->Max).x;
  fVar2 = (item_rect->Max).y;
  auVar1._4_4_ = -(uint)(fVar7 <= fVar6);
  auVar1._0_4_ = -(uint)(fVar5 <= fVar10);
  auVar1._8_4_ = -(uint)(fVar11 <= fVar8);
  auVar1._12_4_ = -(uint)(fVar2 <= fVar9);
  iVar4 = movmskps(in_EAX,auVar1);
  if (iVar4 == 0xf) {
    return;
  }
  if (window->ScrollbarX == true) {
    if (fVar5 <= fVar10) {
      if (fVar11 < fVar8) goto LAB_0019f177;
      fVar10 = (fVar11 - (window->Pos).x) + (window->Scroll).x + (GImGui->Style).ItemSpacing.x;
      fVar11 = 1.0;
    }
    else {
      fVar10 = ((fVar10 - (window->Pos).x) + (window->Scroll).x) - (GImGui->Style).ItemSpacing.x;
      fVar11 = 0.0;
    }
    (window->ScrollTarget).x = fVar10;
    (window->ScrollTargetCenterRatio).x = fVar11;
  }
LAB_0019f177:
  if (fVar7 <= fVar6) {
    if (fVar2 < fVar9) {
      return;
    }
    fVar10 = (fVar2 - (window->Pos).y) + (window->Scroll).y + (pIVar3->Style).ItemSpacing.y;
    fVar6 = 1.0;
  }
  else {
    fVar10 = ((fVar6 - (window->Pos).y) + (window->Scroll).y) - (pIVar3->Style).ItemSpacing.y;
    fVar6 = 0.0;
  }
  (window->ScrollTarget).y = fVar10;
  (window->ScrollTargetCenterRatio).y = fVar6;
  return;
}

Assistant:

static void NavScrollToBringItemIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    // Scroll to keep newly navigated item fully into view
    ImRect window_rect(window->InnerMainRect.Min - ImVec2(1, 1), window->InnerMainRect.Max + ImVec2(1, 1));
    //g.OverlayDrawList.AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]
    if (window_rect.Contains(item_rect))
        return;

    ImGuiContext& g = *GImGui;
    if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
    {
        window->ScrollTarget.x = item_rect.Min.x - window->Pos.x + window->Scroll.x - g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 0.0f;
    }
    else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
    {
        window->ScrollTarget.x = item_rect.Max.x - window->Pos.x + window->Scroll.x + g.Style.ItemSpacing.x;
        window->ScrollTargetCenterRatio.x = 1.0f;
    }
    if (item_rect.Min.y < window_rect.Min.y)
    {
        window->ScrollTarget.y = item_rect.Min.y - window->Pos.y + window->Scroll.y - g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 0.0f;
    }
    else if (item_rect.Max.y >= window_rect.Max.y)
    {
        window->ScrollTarget.y = item_rect.Max.y - window->Pos.y + window->Scroll.y + g.Style.ItemSpacing.y;
        window->ScrollTargetCenterRatio.y = 1.0f;
    }
}